

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O2

Index __thiscall MADPComponentDiscreteStates::SampleInitialState(MADPComponentDiscreteStates *this)

{
  StateDistributionVector *pSVar1;
  int iVar2;
  reference pvVar3;
  ostream *poVar4;
  E *this_00;
  ulong __n;
  double dVar5;
  stringstream ss;
  ostream local_190 [376];
  
  if (this->_m_initialized == false) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar4 = std::operator<<(local_190,"MADPComponentDiscreteStates::SampleInitialState()");
    poVar4 = std::operator<<(poVar4," - Error: not initialized. ");
    std::endl<char,std::char_traits<char>>(poVar4);
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,&ss);
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
  iVar2 = rand();
  __n = 0;
  dVar5 = 0.0;
  while( true ) {
    pSVar1 = this->_m_initialStateDistribution;
    if ((ulong)((long)(pSVar1->super_SDV).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pSVar1->super_SDV).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) <= __n) {
      return 0;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::at(&pSVar1->super_SDV,__n);
    dVar5 = dVar5 + *pvVar3;
    if ((double)iVar2 * 4.656612873077393e-10 <= dVar5) break;
    __n = (ulong)((Index)__n + 1);
  }
  return (Index)__n;
}

Assistant:

Index MADPComponentDiscreteStates::SampleInitialState() const
{
  if(!_m_initialized)
  {
    stringstream ss;
    ss << "MADPComponentDiscreteStates::SampleInitialState()" <<
      " - Error: not initialized. " << endl;
    throw E(ss);
  }
  
  double randNr=rand() / (RAND_MAX + 1.0);

  double sum=0;
  Index state=0,i;
  for(i=0;i<_m_initialStateDistribution->size();i++)
  {
    sum+= _m_initialStateDistribution->at(i);
    if(randNr<=sum)
    {
      state=i;
      break;
    }
  }

  return(state);
}